

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O2

void __thiscall spvtools::opt::analysis::TypeManager::AnalyzeTypes(TypeManager *this,Module *module)

{
  mapped_type mVar1;
  Instruction *this_00;
  Type *pTVar2;
  mapped_type pTVar3;
  uint __line;
  pointer ppIVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  int iVar8;
  mapped_type *ppIVar9;
  Type *pTVar10;
  undefined4 extraout_var;
  long lVar11;
  mapped_type *ppTVar12;
  undefined4 extraout_var_00;
  DecorationManager *this_01;
  mapped_type *pmVar13;
  __node_base *p_Var14;
  UnresolvedType *type_2;
  pointer ppIVar15;
  pointer pUVar16;
  TypeManager *pTVar17;
  char *__assertion;
  pointer pUVar18;
  UnresolvedType *type;
  pointer pUVar19;
  __node_base *p_Var20;
  __node_base *p_Var21;
  __node_base *p_Var22;
  __ireturn_type _Var23;
  key_type local_70;
  pointer local_68;
  Module *local_60;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> decorations;
  
  local_60 = module;
  Module::GetConstants
            ((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
              *)&decorations,module);
  ppIVar4 = decorations.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar15 = (pointer)CONCAT44(decorations.
                                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (uint32_t)
                                    decorations.
                                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start); ppIVar15 != ppIVar4;
      ppIVar15 = ppIVar15 + 1) {
    this_00 = *ppIVar15;
    uVar7 = Instruction::result_id(this_00);
    local_70 = (key_type)CONCAT44(local_70._4_4_,uVar7);
    ppIVar9 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->id_to_constant_inst_,(key_type *)&local_70);
    *ppIVar9 = this_00;
  }
  std::
  _Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  ::~_Vector_base((_Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                   *)&decorations);
  Module::GetTypes((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                    *)&decorations,local_60);
  ppIVar4 = decorations.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar15 = (pointer)CONCAT44(decorations.
                                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (uint32_t)
                                    decorations.
                                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start); ppIVar15 != ppIVar4;
      ppIVar15 = ppIVar15 + 1) {
    RecordIfTypeDefinition(this,*ppIVar15);
  }
  pTVar17 = (TypeManager *)&decorations;
  std::
  _Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  ::~_Vector_base((_Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                   *)pTVar17);
  pUVar18 = (this->incomplete_types_).
            super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pUVar16 = (this->incomplete_types_).
            super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pUVar18 != pUVar16) {
    for (; pUVar18 != pUVar16; pUVar18 = pUVar18 + 1) {
      if (((pUVar18->type_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl)->kind_ ==
          kForwardPointer) {
        pTVar10 = GetType(this,pUVar18->id_);
        if (pTVar10 == (Type *)0x0) {
          __assertion = "t";
          __line = 0x5a;
LAB_00498fe2:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                        ,__line,
                        "void spvtools::opt::analysis::TypeManager::AnalyzeTypes(const Module &)");
        }
        iVar8 = (*pTVar10->_vptr_Type[0x21])(pTVar10);
        if (CONCAT44(extraout_var,iVar8) == 0) {
          __assertion = "p";
          __line = 0x5c;
          goto LAB_00498fe2;
        }
        pTVar17 = (TypeManager *)
                  (pUVar18->type_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
        lVar11 = (**(code **)(*(long *)&((_Vector_impl *)&pTVar17->consumer_)->
                                        super__Vector_impl_data + 0x178))();
        *(long *)(lVar11 + 0x30) = CONCAT44(extraout_var,iVar8);
      }
    }
    pUVar16 = (this->incomplete_types_).
              super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pUVar18 = (this->incomplete_types_).
                   super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
                   ._M_impl.super__Vector_impl_data._M_start; pUVar18 != pUVar16;
        pUVar18 = pUVar18 + 1) {
      ReplaceForwardPointers
                (pTVar17,(pUVar18->type_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl
                );
    }
    pUVar16 = (this->incomplete_types_).
              super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pUVar18 = (this->incomplete_types_).
                   super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
                   ._M_impl.super__Vector_impl_data._M_start; pUVar18 != pUVar16;
        pUVar18 = pUVar18 + 1) {
      pTVar10 = (pUVar18->type_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
      if (pTVar10->kind_ == kForwardPointer) {
        (pUVar18->type_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
        .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl = (Type *)0x0;
        (*pTVar10->_vptr_Type[1])();
      }
    }
    local_60 = (Module *)&this->id_to_incomplete_type_;
    pUVar18 = (this->incomplete_types_).
              super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar6 = false;
      pUVar16 = (this->incomplete_types_).
                super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_68 = pUVar16;
      for (; pUVar19 = local_68 + 1, pUVar16 != pUVar18; pUVar16 = pUVar16 + 1) {
        pTVar10 = (pUVar16->type_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
        local_68 = pUVar19;
        if (pTVar10 != (Type *)0x0) {
          for (; pUVar19 != pUVar18; pUVar19 = pUVar19 + 1) {
            pTVar2 = (pUVar19->type_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
            if ((pTVar2 != (Type *)0x0) && (bVar5 = analysis::Type::IsSame(pTVar10,pTVar2), bVar5))
            {
              ReplaceType(this,pTVar10,pTVar2);
              pTVar2 = (pUVar19->type_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
              (pUVar19->type_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
                   (Type *)0x0;
              if (pTVar2 != (Type *)0x0) {
                (*pTVar2->_vptr_Type[1])();
              }
              decorations.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = pUVar19->id_;
              ppTVar12 = std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)local_60,(key_type *)&decorations);
              *ppTVar12 = pTVar10;
              bVar6 = true;
            }
            pUVar18 = (this->incomplete_types_).
                      super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
      }
    } while (bVar6);
    local_68 = (pointer)&this->id_to_type_;
    for (pUVar16 = (this->incomplete_types_).
                   super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
                   ._M_impl.super__Vector_impl_data._M_start; pUVar19 = local_68,
        pTVar17 = (TypeManager *)&decorations, pUVar16 != pUVar18; pUVar16 = pUVar16 + 1) {
      pTVar10 = (pUVar16->type_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
      if ((pTVar10 != (Type *)0x0) &&
         (iVar8 = (*pTVar10->_vptr_Type[0x2f])(), CONCAT44(extraout_var_00,iVar8) == 0)) {
        this_01 = IRContext::get_decoration_mgr(this->context_);
        DecorationManager::GetDecorationsFor
                  ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)pTVar17,this_01,pUVar16->id_,true);
        ppIVar4 = decorations.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppIVar15 = (pointer)CONCAT44(decorations.
                                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (uint32_t)
                                          decorations.
                                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
            ppIVar15 != ppIVar4; ppIVar15 = ppIVar15 + 1) {
          AttachDecoration(pTVar17,*ppIVar15,
                           (pUVar16->type_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>.
                           _M_head_impl);
        }
        _Var23 = std::__detail::
                 _Insert<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>,_std::__detail::_Identity,_spvtools::opt::analysis::CompareTypeUniquePointers,_spvtools::opt::analysis::HashTypeUniquePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                 ::insert((_Insert<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>,_std::__detail::_Identity,_spvtools::opt::analysis::CompareTypeUniquePointers,_spvtools::opt::analysis::HashTypeUniquePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                           *)&this->type_pool_,&pUVar16->type_);
        pTVar3 = *(mapped_type *)
                  ((long)_Var23.first.
                         super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                         ._M_cur.
                         super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  + 8);
        local_70 = (key_type)CONCAT44(local_70._4_4_,pUVar16->id_);
        ppTVar12 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)local_68,(key_type *)&local_70);
        *ppTVar12 = pTVar3;
        mVar1 = pUVar16->id_;
        local_70 = *(key_type *)
                    ((long)_Var23.first.
                           super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                           ._M_cur.
                           super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                    + 8);
        pmVar13 = std::__detail::
                  _Map_base<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->type_to_id_,&local_70);
        *pmVar13 = mVar1;
        local_70 = (key_type)CONCAT44(local_70._4_4_,pUVar16->id_);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)local_60,&local_70);
        std::
        _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        ~_Vector_base(&decorations.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     );
      }
    }
    p_Var20 = &(this->id_to_incomplete_type_)._M_h._M_before_begin;
    while (p_Var20 = p_Var20->_M_nxt, p_Var20 != (__node_base *)0x0) {
      pTVar3 = *(mapped_type *)&((_Prime_rehash_policy *)(p_Var20 + 2))->_M_max_load_factor;
      ppTVar12 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)pUVar19,(key_type *)(p_Var20 + 1));
      *ppTVar12 = pTVar3;
    }
    p_Var14 = &(this->type_pool_)._M_h._M_before_begin;
    p_Var21 = p_Var14;
    while (p_Var21 = p_Var21->_M_nxt, p_Var22 = p_Var14, p_Var21 != (__node_base *)0x0) {
      while (p_Var22 = p_Var22->_M_nxt, p_Var22 != (__node_base *)0x0) {
        if ((p_Var21[1]._M_nxt != p_Var22[1]._M_nxt) &&
           (bVar6 = analysis::Type::IsSame((Type *)p_Var21[1]._M_nxt,(Type *)p_Var22[1]._M_nxt),
           bVar6)) {
          __assert_fail("(ti == tj || !ti->IsSame(tj)) && \"Type pool contains two types that are the same.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                        ,0xac,
                        "void spvtools::opt::analysis::TypeManager::AnalyzeTypes(const Module &)");
        }
      }
    }
  }
  return;
}

Assistant:

void TypeManager::AnalyzeTypes(const Module& module) {
  // First pass through the constants, as some will be needed when traversing
  // the types in the next pass.
  for (const auto* inst : module.GetConstants()) {
    id_to_constant_inst_[inst->result_id()] = inst;
  }

  // Then pass through the types.  Any types that reference a forward pointer
  // (directly or indirectly) are incomplete, and are added to incomplete types.
  for (const auto* inst : module.GetTypes()) {
    RecordIfTypeDefinition(*inst);
  }

  if (incomplete_types_.empty()) {
    return;
  }

  // Get the real pointer definition for all of the forward pointers.
  for (auto& type : incomplete_types_) {
    if (type.type()->kind() == Type::kForwardPointer) {
      auto* t = GetType(type.id());
      assert(t);
      auto* p = t->AsPointer();
      assert(p);
      type.type()->AsForwardPointer()->SetTargetPointer(p);
    }
  }

  // Replaces the references to the forward pointers in the incomplete types.
  for (auto& type : incomplete_types_) {
    ReplaceForwardPointers(type.type());
  }

  // Delete the forward pointers now that they are not referenced anymore.
  for (auto& type : incomplete_types_) {
    if (type.type()->kind() == Type::kForwardPointer) {
      type.ResetType(nullptr);
    }
  }

  // Compare the complete types looking for types that are the same.  If there
  // are two types that are the same, then replace one with the other.
  // Continue until we reach a fixed point.
  bool restart = true;
  while (restart) {
    restart = false;
    for (auto it1 = incomplete_types_.begin(); it1 != incomplete_types_.end();
         ++it1) {
      uint32_t id1 = it1->id();
      Type* type1 = it1->type();
      if (!type1) {
        continue;
      }

      for (auto it2 = it1 + 1; it2 != incomplete_types_.end(); ++it2) {
        uint32_t id2 = it2->id();
        (void)(id2 + id1);
        Type* type2 = it2->type();
        if (!type2) {
          continue;
        }

        if (type1->IsSame(type2)) {
          ReplaceType(type1, type2);
          it2->ResetType(nullptr);
          id_to_incomplete_type_[it2->id()] = type1;
          restart = true;
        }
      }
    }
  }

  // Add the remaining incomplete types to the type pool.
  for (auto& type : incomplete_types_) {
    if (type.type() && !type.type()->AsForwardPointer()) {
      std::vector<Instruction*> decorations =
          context()->get_decoration_mgr()->GetDecorationsFor(type.id(), true);
      for (auto dec : decorations) {
        AttachDecoration(*dec, type.type());
      }
      auto pair = type_pool_.insert(type.ReleaseType());
      id_to_type_[type.id()] = pair.first->get();
      type_to_id_[pair.first->get()] = type.id();
      id_to_incomplete_type_.erase(type.id());
    }
  }

  // Add a mapping for any ids that whose original type was replaced by an
  // equivalent type.
  for (auto& type : id_to_incomplete_type_) {
    id_to_type_[type.first] = type.second;
  }

#ifndef NDEBUG
  // Check if the type pool contains two types that are the same.  This
  // is an indication that the hashing and comparison are wrong.  It
  // will cause a problem if the type pool gets resized and everything
  // is rehashed.
  for (auto& i : type_pool_) {
    for (auto& j : type_pool_) {
      Type* ti = i.get();
      Type* tj = j.get();
      assert((ti == tj || !ti->IsSame(tj)) &&
             "Type pool contains two types that are the same.");
    }
  }
#endif
}